

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

char * __thiscall FIX::double_conversion::StringBuilder::Finalize(StringBuilder *this)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  
  iVar1 = this->position_;
  if ((-1 < (long)iVar1) && (iVar1 < (this->buffer_).length_)) {
    (this->buffer_).start_[iVar1] = '\0';
    __s = (this->buffer_).start_;
    sVar2 = strlen(__s);
    if (sVar2 == (long)this->position_) {
      this->position_ = -1;
      return __s;
    }
    __assert_fail("strlen(buffer_.start()) == static_cast<size_t>(position_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0x116,"char *FIX::double_conversion::StringBuilder::Finalize()");
  }
  __assert_fail("!is_finalized() && position_ < buffer_.length()",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                ,0x112,"char *FIX::double_conversion::StringBuilder::Finalize()");
}

Assistant:

bool is_finalized() const { return position_ < 0; }